

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmutil.c
# Opt level: O0

PmError Pm_QueueDestroy(PmQueue *q)

{
  PmQueueRep *queue;
  PmQueue *q_local;
  
  if (((q == (PmQueue *)0x0) || (*(long *)((long)q + 0x28) == 0)) ||
     (*(long *)((long)q + 0x30) == 0)) {
    q_local._4_4_ = pmBadPtr;
  }
  else {
    pm_free(*(void **)((long)q + 0x30));
    pm_free(*(void **)((long)q + 0x28));
    pm_free(q);
    q_local._4_4_ = pmNoData;
  }
  return q_local._4_4_;
}

Assistant:

PMEXPORT PmError Pm_QueueDestroy(PmQueue *q)
{
    PmQueueRep *queue = (PmQueueRep *) q;
        
    /* arg checking */
    if (!queue || !queue->buffer || !queue->peek) 
                return pmBadPtr;
    
    pm_free(queue->peek);
    pm_free(queue->buffer);
    pm_free(queue);
    return pmNoError;
}